

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O3

void frssort(string *strings,size_t scnt)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  undefined8 uVar5;
  group pgVar6;
  uint uVar7;
  list_conflict __ptr;
  group_conflict g;
  group pgVar8;
  long lVar9;
  list_conflict plVar10;
  undefined8 *puVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  char cVar16;
  list plVar17;
  undefined8 *puVar18;
  list_conflict plVar19;
  int in_R8D;
  uint p;
  uint uVar20;
  int *used2;
  character used1 [257];
  long local_8a0;
  uint local_848 [256];
  uint local_448;
  bucket_conflict local_438 [128];
  int local_38;
  
  __ptr = (list_conflict)calloc(scnt,0x18);
  if (scnt != 0) {
    uVar15 = 0;
    plVar10 = __ptr;
    do {
      plVar10->str = strings[uVar15];
      plVar19 = (list_conflict)0x0;
      if (uVar15 < scnt - 1) {
        plVar19 = plVar10 + 1;
      }
      plVar10->next = plVar19;
      uVar15 = uVar15 + 1;
      plVar10 = plVar10 + 1;
    } while (scnt != uVar15);
    plVar17 = __ptr;
    if (1 < (int)scnt) {
      initmem(groupmem,0x30,(int)((scnt & 0xffffffff) / 0xf));
      initmem(bucketmem,0x28,(int)((scnt & 0xffffffff) / 5));
      g = (group_conflict)allocmem(groupmem,0x30);
      pgVar8 = (group)allocmem(groupmem,0x30);
      g->nextunf = pgVar8;
      g->next = pgVar8;
      pgVar8->head = __ptr;
      pgVar8->finis = 0;
      pgVar8->next = (group)0x0;
      pgVar8->nextunf = (group)0x0;
      used2 = (int *)0x0;
      intobuckets(g,local_438,(int *)local_848,(int *)0x0,in_R8D);
      while (uVar7 = local_448, g->nextunf != (group)0x0) {
        p = (int)used2 + 2;
        used2 = (int *)(ulong)p;
        lVar9 = (long)local_38;
        if (0 < lVar9) {
          uVar15 = (ulong)local_448;
          local_8a0 = 0;
          do {
            if (0 < (int)uVar7) {
              iVar1 = *(int *)((long)local_438 + local_8a0 * 4);
              uVar12 = 0;
              do {
                lVar14 = (long)(int)(local_848[uVar12] | iVar1 << 8);
                puVar18 = *(undefined8 **)(forward2_b + lVar14 * 8);
                if (puVar18 != (undefined8 *)0x0) {
                  cVar16 = (char)local_848[uVar12];
                  do {
                    if ((cVar16 == '\0') || (0x13 < *(int *)(puVar18 + 2))) {
                      plVar10 = (list_conflict)*puVar18;
                      uVar20 = (uint)(cVar16 == '\0');
                    }
                    else {
                      plVar10 = (list_conflict)*puVar18;
                      uVar20 = 1;
                      if (1 < *(int *)(puVar18 + 2)) {
                        plVar10 = ForListInsertsort(plVar10,(list_conflict *)(puVar18 + 1),p);
                        *puVar18 = plVar10;
                      }
                    }
                    lVar2 = puVar18[1];
                    plVar3 = (long *)puVar18[3];
                    if (*plVar3 == 0) {
                      *plVar3 = (long)plVar10;
                      plVar3[1] = lVar2;
                      *(uint *)(plVar3 + 5) = uVar20;
                      plVar3[4] = (long)plVar3;
                    }
                    else if ((uVar20 == 0) || (lVar4 = plVar3[4], *(int *)(lVar4 + 0x28) == 0)) {
                      puVar11 = (undefined8 *)allocmem(groupmem,0x30);
                      *puVar11 = plVar10;
                      puVar11[1] = lVar2;
                      lVar2 = plVar3[4];
                      uVar5 = *(undefined8 *)(lVar2 + 0x18);
                      puVar11[2] = *(undefined8 *)(lVar2 + 0x10);
                      puVar11[3] = uVar5;
                      *(uint *)(puVar11 + 5) = uVar20;
                      *(undefined8 **)(lVar2 + 0x10) = puVar11;
                      *(undefined8 **)(lVar2 + 0x18) = puVar11;
                      plVar3[4] = (long)puVar11;
                    }
                    else {
                      *(list_conflict *)(*(long *)(lVar4 + 8) + 8) = plVar10;
                      *(long *)(lVar4 + 8) = lVar2;
                    }
                    puVar18 = (undefined8 *)puVar18[4];
                  } while (puVar18 != (undefined8 *)0x0);
                  *(undefined8 *)(forward2_b + lVar14 * 8) = 0;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar15);
            }
            local_8a0 = local_8a0 + 1;
          } while (local_8a0 != lVar9);
        }
        intobuckets(g,local_438,(int *)local_848,used2,in_R8D);
      }
      pgVar8 = g->next;
      plVar17 = pgVar8->head;
      for (pgVar6 = pgVar8->next; pgVar6 != (group)0x0; pgVar6 = pgVar6->next) {
        pgVar8->tail->next = pgVar6->head;
        pgVar8 = pgVar6;
      }
      freemem(bucketmem);
      freemem(groupmem);
      if (scnt == 0) goto LAB_00252a7e;
    }
    sVar13 = 0;
    do {
      strings[sVar13] = plVar17->str;
      sVar13 = sVar13 + 1;
      plVar17 = plVar17->next;
    } while (scnt != sVar13);
  }
LAB_00252a7e:
  free(__ptr);
  return;
}

Assistant:

void frssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward2(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}